

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printNum(JSPrinter *this,Ref node)

{
  size_t sVar1;
  char *s;
  
  if ((node.inst)->type == Number) {
    if ((((node.inst)->field_1).num <= 0.0 && ((node.inst)->field_1).num != 0.0) &&
       (this->buffer[this->used - 1] == '-')) {
      maybeSpace(this,' ');
      ensure(this,1);
      sVar1 = this->used;
      this->used = sVar1 + 1;
      this->buffer[sVar1] = ' ';
    }
    if ((node.inst)->type == Number) {
      s = numToString(((node.inst)->field_1).num,this->finalize);
      emit(this,s);
      return;
    }
  }
  __assert_fail("isNumber()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0xf4,"double &cashew::Value::getNumber()");
}

Assistant:

void printNum(Ref node) {
    if (node->getNumber() < 0 && buffer[used - 1] == '-') {
      emit(' '); // cannot join - and - to --, looks like the -- operator
    }
    emit(numToString(node->getNumber(), finalize));
  }